

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O2

AffixPatternMatcher * __thiscall
icu_63::numparse::impl::AffixPatternMatcher::operator=
          (AffixPatternMatcher *this,AffixPatternMatcher *param_1)

{
  ArraySeriesMatcher::operator=(&this->super_ArraySeriesMatcher,&param_1->super_ArraySeriesMatcher);
  MaybeStackArray<char16_t,_4>::operator=(&(this->fPattern).fBuffer,&(param_1->fPattern).fBuffer);
  return this;
}

Assistant:

class U_I18N_API AffixPatternMatcher : public ArraySeriesMatcher {
  public:
    AffixPatternMatcher() = default;  // WARNING: Leaves the object in an unusable state

    static AffixPatternMatcher fromAffixPattern(const UnicodeString& affixPattern,
                                                AffixTokenMatcherWarehouse& warehouse,
                                                parse_flags_t parseFlags, bool* success,
                                                UErrorCode& status);

    UnicodeString getPattern() const;

    bool operator==(const AffixPatternMatcher& other) const;

  private:
    CompactUnicodeString<4> fPattern;

    AffixPatternMatcher(MatcherArray& matchers, int32_t matchersLen, const UnicodeString& pattern);

    friend class AffixPatternMatcherBuilder;
}